

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

int pybind11_traverse(PyObject *self,visitproc visit,void *arg)

{
  long *plVar1;
  int vret_1;
  int vret;
  PyObject **dict;
  void *arg_local;
  visitproc visit_local;
  PyObject *self_local;
  
  plVar1 = (long *)_PyObject_GetDictPtr(self);
  if (((*plVar1 == 0) ||
      (self_local._4_4_ = (*visit)((PyObject *)*plVar1,arg), self_local._4_4_ == 0)) &&
     ((self->ob_type == (PyTypeObject *)0x0 ||
      (self_local._4_4_ = (*visit)((PyObject *)self->ob_type,arg), self_local._4_4_ == 0)))) {
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

inline int pybind11_traverse(PyObject *self, visitproc visit, void *arg) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject_VisitManagedDict(self, visit, arg);
#else
    PyObject *&dict = *_PyObject_GetDictPtr(self);
    Py_VISIT(dict);
#endif
// https://docs.python.org/3/c-api/typeobj.html#c.PyTypeObject.tp_traverse
#if PY_VERSION_HEX >= 0x03090000
    Py_VISIT(Py_TYPE(self));
#endif
    return 0;
}